

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O3

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::TraceInstruction
          (UpgradeMemoryModel *this,Instruction *inst,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *visited)

{
  iterator iVar1;
  pointer pOVar2;
  uint **ppuVar3;
  UpgradeMemoryModel *this_00;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  char cVar7;
  pair<bool,_bool> pVar8;
  undefined2 uVar9;
  uint32_t uVar12;
  Op OVar13;
  iterator iVar14;
  mapped_type *pmVar15;
  uint **ppuVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  __hashtable *__h;
  pointer pOVar20;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar21;
  bool is_volatile;
  bool is_coherent;
  __node_gen_type __node_gen;
  undefined1 local_92 [2];
  key_type local_90;
  UpgradeMemoryModel *local_70;
  mapped_type *local_68;
  __buckets_ptr local_60;
  size_type local_58;
  __node_base local_50;
  code *local_48;
  __node_base local_40;
  uint *local_38;
  undefined2 uVar10;
  undefined2 uVar11;
  
  local_90.first = 0;
  local_70 = this;
  local_40._M_nxt = (_Hash_node_base *)visited;
  if (inst->has_result_id_ == true) {
    local_90.first = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90.second,indices);
  iVar14 = std::
           _Hashtable<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_spvtools::opt::CacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->cache_)._M_h,&local_90);
  if (local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.second.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.second.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar14.
      super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    uVar9._0_1_ = ((pair<bool,_bool> *)
                  ((long)iVar14.
                         super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
                         ._M_cur + 0x28))->first;
    uVar9._1_1_ = ((pair<bool,_bool> *)
                  ((long)iVar14.
                         super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
                         ._M_cur + 0x28))->second;
    return (pair<bool,_bool>)uVar9;
  }
  uVar12 = 0;
  if (inst->has_result_id_ == true) {
    uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  local_60 = (__buckets_ptr)CONCAT44(local_60._4_4_,uVar12);
  local_90._0_8_ = visited;
  pVar21 = std::
           _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           ::
           _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                     ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)visited);
  uVar12 = 0;
  if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar11._0_1_ = false;
    uVar11._1_1_ = false;
    return (pair<bool,_bool>)uVar11;
  }
  if (inst->has_result_id_ == true) {
    uVar12 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  local_90.first = uVar12;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90.second,indices);
  pmVar15 = std::__detail::
            _Map_base<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_spvtools::opt::CacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_spvtools::opt::CacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->cache_,&local_90);
  if (local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.second.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.second.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this_00 = local_70;
  pmVar15->first = false;
  pmVar15->second = false;
  bVar4 = 0;
  local_92[1] = 0;
  local_92[0] = 0;
  OVar13 = inst->opcode_;
  if ((int)OVar13 < 0x41) {
    if ((OVar13 == OpFunctionParameter) || (bVar5 = 0, OVar13 == OpVariable)) {
      uVar12 = 0;
      bVar4 = HasDecoration(local_70,inst,0,Coherent);
      local_92[1] = bVar4;
      bVar5 = HasDecoration(this_00,inst,0,Volatile);
      if (!(bool)bVar5 || !(bool)bVar4) {
        local_92[0] = bVar5;
        if (inst->has_type_id_ == true) {
          uVar12 = Instruction::GetSingleWordOperand(inst,0);
        }
        pVar8 = CheckType(local_70,uVar12,indices);
        bVar4 = bVar4 | pVar8.first;
        bVar5 = bVar5 | pVar8.second;
        local_92[1] = bVar4;
      }
      local_92[0] = bVar5;
      if (((bVar4 & 1) != 0) && ((bVar5 & 1) != 0)) {
        pmVar15->first = true;
        pmVar15->second = true;
        uVar10._0_1_ = true;
        uVar10._1_1_ = true;
        return (pair<bool,_bool>)uVar10;
      }
      goto LAB_001b0987;
    }
  }
  else {
    if (OVar13 - OpAccessChain < 2) {
      uVar18 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar18 = (uint)inst->has_result_id_;
      }
      iVar17 = ~uVar18 + (int)((ulong)((long)(inst->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555;
      if (iVar17 != 0) {
        do {
          uVar18 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar18 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar18 + iVar17);
          local_90.first = uVar12;
          iVar1._M_current =
               (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(indices,iVar1,&local_90.first);
          }
          else {
            *iVar1._M_current = uVar12;
            (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
    }
    else {
      bVar5 = 0;
      if (OVar13 != OpPtrAccessChain) goto LAB_001b098a;
      uVar18 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar18 = (uint)inst->has_result_id_;
      }
      uVar18 = ~uVar18 + (int)((ulong)((long)(inst->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555;
      if (1 < uVar18) {
        do {
          uVar19 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar19 = (uint)inst->has_result_id_;
          }
          uVar12 = Instruction::GetSingleWordOperand(inst,uVar19 + uVar18);
          local_90.first = uVar12;
          iVar1._M_current =
               (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(indices,iVar1,&local_90.first);
          }
          else {
            *iVar1._M_current = uVar12;
            (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          uVar18 = uVar18 - 1;
        } while (1 < uVar18);
      }
    }
    bVar4 = 0;
    bVar5 = 0;
LAB_001b0987:
    OVar13 = inst->opcode_;
  }
LAB_001b098a:
  local_68 = pmVar15;
  if ((OVar13 == OpFunctionParameter) || (OVar13 == OpVariable)) goto LAB_001b0ab8;
  local_58 = 0;
  local_60 = (__buckets_ptr)operator_new(0x28);
  *local_60 = (__node_base_ptr)local_70;
  local_60[1] = (__node_base_ptr)(local_92 + 1);
  local_60[2] = (__node_base_ptr)local_92;
  local_60[3] = (__node_base_ptr)indices;
  local_60[4] = &local_40;
  local_48 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:384:23)>
             ::_M_invoke;
  local_50._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:384:23)>
       ::_M_manager;
  local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90._0_8_ = &local_60;
  local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
                ::_M_invoke;
  local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
                ::_M_manager;
  pOVar20 = (inst->operands_).
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar20 == pOVar2) {
LAB_001b0a81:
    (*(code *)local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish)(&local_90,&local_90,3);
  }
  else {
    do {
      bVar6 = spvIsInIdType(pOVar20->type);
      if (bVar6) {
        ppuVar3 = (uint **)(pOVar20->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar16 = &(pOVar20->words).small_data_;
        if (ppuVar3 != (uint **)0x0) {
          ppuVar16 = ppuVar3;
        }
        local_38 = *ppuVar16;
        if ((code *)local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar7 = (*(code *)local_90.second.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)(&local_90,&local_38);
        if (cVar7 == '\0') break;
      }
      pOVar20 = pOVar20 + 1;
    } while (pOVar20 != pOVar2);
    if ((code *)local_90.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish != (code *)0x0) goto LAB_001b0a81;
  }
  bVar4 = local_92[1];
  bVar5 = local_92[0];
  if (local_50._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)local_50._M_nxt)(&local_60,&local_60,3);
    bVar4 = local_92[1];
    bVar5 = local_92[0];
  }
LAB_001b0ab8:
  local_68->first = (bool)bVar4;
  local_68->second = (bool)bVar5;
  pVar8.second = (bool)bVar5;
  pVar8.first = (bool)bVar4;
  return pVar8;
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::TraceInstruction(
    Instruction* inst, std::vector<uint32_t> indices,
    std::unordered_set<uint32_t>* visited) {
  auto iter = cache_.find(std::make_pair(inst->result_id(), indices));
  if (iter != cache_.end()) {
    return iter->second;
  }

  if (!visited->insert(inst->result_id()).second) {
    return std::make_pair(false, false);
  }

  // Initialize the cache before |indices| is (potentially) modified.
  auto& cached_result = cache_[std::make_pair(inst->result_id(), indices)];
  cached_result.first = false;
  cached_result.second = false;

  bool is_coherent = false;
  bool is_volatile = false;
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpFunctionParameter:
      is_coherent |= HasDecoration(inst, 0, spv::Decoration::Coherent);
      is_volatile |= HasDecoration(inst, 0, spv::Decoration::Volatile);
      if (!is_coherent || !is_volatile) {
        bool type_coherent = false;
        bool type_volatile = false;
        std::tie(type_coherent, type_volatile) =
            CheckType(inst->type_id(), indices);
        is_coherent |= type_coherent;
        is_volatile |= type_volatile;
      }
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
      // Store indices in reverse order.
      for (uint32_t i = inst->NumInOperands() - 1; i > 0; --i) {
        indices.push_back(inst->GetSingleWordInOperand(i));
      }
      break;
    case spv::Op::OpPtrAccessChain:
      // Store indices in reverse order. Skip the |Element| operand.
      for (uint32_t i = inst->NumInOperands() - 1; i > 1; --i) {
        indices.push_back(inst->GetSingleWordInOperand(i));
      }
      break;
    default:
      break;
  }

  // No point searching further.
  if (is_coherent && is_volatile) {
    cached_result.first = true;
    cached_result.second = true;
    return std::make_pair(true, true);
  }

  // Variables and function parameters are sources. Continue searching until we
  // reach them.
  if (inst->opcode() != spv::Op::OpVariable &&
      inst->opcode() != spv::Op::OpFunctionParameter) {
    inst->ForEachInId([this, &is_coherent, &is_volatile, &indices,
                       &visited](const uint32_t* id_ptr) {
      Instruction* op_inst = context()->get_def_use_mgr()->GetDef(*id_ptr);
      const analysis::Type* type =
          context()->get_type_mgr()->GetType(op_inst->type_id());
      if (type &&
          (type->AsPointer() || type->AsImage() || type->AsSampledImage())) {
        bool operand_coherent = false;
        bool operand_volatile = false;
        std::tie(operand_coherent, operand_volatile) =
            TraceInstruction(op_inst, indices, visited);
        is_coherent |= operand_coherent;
        is_volatile |= operand_volatile;
      }
    });
  }

  cached_result.first = is_coherent;
  cached_result.second = is_volatile;
  return std::make_pair(is_coherent, is_volatile);
}